

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int new_socket(uv_tcp_t *handle,int domain,uint flags)

{
  int iVar1;
  int err;
  int sockfd;
  uint flags_local;
  int domain_local;
  uv_tcp_t *handle_local;
  
  handle_local._4_4_ = uv__socket(domain,1,0);
  if (-1 < handle_local._4_4_) {
    iVar1 = uv__stream_open((uv_stream_t *)handle,handle_local._4_4_,flags);
    if (iVar1 == 0) {
      if ((flags & 0x2000) == 0) {
        handle_local._4_4_ = 0;
      }
      else {
        handle_local._4_4_ = maybe_bind_socket(handle_local._4_4_);
      }
    }
    else {
      uv__close(handle_local._4_4_);
      handle_local._4_4_ = iVar1;
    }
  }
  return handle_local._4_4_;
}

Assistant:

static int new_socket(uv_tcp_t* handle, int domain, unsigned int flags) {
  int sockfd;
  int err;

  sockfd = uv__socket(domain, SOCK_STREAM, 0);
  if (sockfd < 0)
    return sockfd;

  err = uv__stream_open((uv_stream_t*) handle, sockfd, flags);
  if (err) {
    uv__close(sockfd);
    return err;
  }

  if (flags & UV_HANDLE_BOUND)
    return maybe_bind_socket(sockfd);

  return 0;
}